

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

SHADER_TYPE Diligent::GLShaderBitsToShaderTypes(GLenum ShaderBits)

{
  type tVar1;
  SHADER_TYPE local_10;
  type Type;
  SHADER_TYPE Result;
  GLenum ShaderBits_local;
  
  local_10 = SHADER_TYPE_UNKNOWN;
  Type = ShaderBits;
  while (Type != 0) {
    tVar1 = ExtractLSB<unsigned_int>(&Type);
    switch(tVar1) {
    case 1:
      operator|=(&local_10,SHADER_TYPE_VERTEX);
      break;
    case 2:
      operator|=(&local_10,SHADER_TYPE_PIXEL);
      break;
    case 4:
      operator|=(&local_10,SHADER_TYPE_GEOMETRY);
      break;
    case 8:
      operator|=(&local_10,SHADER_TYPE_HULL);
      break;
    case 0x10:
      operator|=(&local_10,SHADER_TYPE_DOMAIN);
      break;
    case 0x20:
      operator|=(&local_10,SHADER_TYPE_COMPUTE);
    }
  }
  return local_10;
}

Assistant:

SHADER_TYPE GLShaderBitsToShaderTypes(GLenum ShaderBits)
{
    SHADER_TYPE Result = SHADER_TYPE_UNKNOWN;
    while (ShaderBits != 0)
    {
        auto Type = ExtractLSB(ShaderBits);
        switch (Type)
        {
            // clang-format off
            case GL_VERTEX_SHADER_BIT:          Result |= SHADER_TYPE_VERTEX;   break;
            case GL_FRAGMENT_SHADER_BIT:        Result |= SHADER_TYPE_PIXEL;    break;
            case GL_GEOMETRY_SHADER_BIT:        Result |= SHADER_TYPE_GEOMETRY; break;
            case GL_TESS_CONTROL_SHADER_BIT:    Result |= SHADER_TYPE_HULL;     break;
            case GL_TESS_EVALUATION_SHADER_BIT: Result |= SHADER_TYPE_DOMAIN;   break;
            case GL_COMPUTE_SHADER_BIT:         Result |= SHADER_TYPE_COMPUTE;  break;
                // clang-format on
        }
    }
    return Result;
}